

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# verifier.c
# Opt level: O1

int flatcc_verify_table_as_nested_root
              (flatcc_table_verifier_descriptor_t *td,flatbuffers_voffset_t id,int required,
              char *fid,uint16_t align,flatcc_table_verifier_f *tvf)

{
  uint uVar1;
  ushort uVar2;
  int iVar3;
  uint *puVar4;
  uint uVar5;
  undefined6 in_register_00000082;
  ulong uVar7;
  uint *buf;
  bool bVar8;
  flatcc_table_verifier_descriptor_t local_50;
  ulong uVar6;
  
  uVar7 = CONCAT62(in_register_00000082,align) & 0xffffffff;
  iVar3 = flatcc_verify_vector_field(td,id,required,uVar7,1,0xffffffff);
  if (iVar3 == 0) {
    uVar2 = id * 2 + 4;
    if (uVar2 < td->vsize) {
      uVar2 = *(ushort *)((long)td->vtable + (ulong)uVar2);
    }
    else {
      uVar2 = 0;
    }
    iVar3 = 0;
    if (uVar2 == 0) {
      puVar4 = (uint *)0x0;
    }
    else {
      puVar4 = (uint *)((long)td->buf + (ulong)uVar2 + (ulong)td->table);
    }
    if (puVar4 != (uint *)0x0) {
      buf = (uint *)((ulong)*puVar4 + (long)puVar4) + 1;
      uVar1 = *(uint *)((ulong)*puVar4 + (long)puVar4);
      uVar7 = (ulong)uVar1;
      iVar3 = flatcc_verify_buffer_header(buf,uVar7,fid);
      if (iVar3 == 0) {
        local_50.table = *buf;
        local_50.ttl = td->ttl + -1;
        if (local_50.ttl == 0) {
          iVar3 = 3;
        }
        else {
          bVar8 = true;
          if ((local_50.table != 0) && ((ulong)local_50.table + 4 <= uVar7)) {
            bVar8 = (local_50.table & 3) != 0;
          }
          if (bVar8) {
            iVar3 = 0xf;
          }
          else {
            uVar5 = local_50.table - *(int *)((long)buf + (ulong)local_50.table);
            uVar6 = (ulong)uVar5;
            iVar3 = 0x1d;
            if ((uVar5 & 1) == 0 && -1 < (int)uVar5) {
              if (uVar7 < uVar6 + 2) {
                iVar3 = 0x1b;
              }
              else {
                local_50.vsize = *(ushort *)((long)buf + uVar6);
                iVar3 = 0x1e;
                if ((local_50.vsize & 1) == 0 && uVar5 + local_50.vsize <= uVar1) {
                  if (local_50.vsize < 4) {
                    iVar3 = 0x1c;
                  }
                  else {
                    local_50.tsize = *(ushort *)((long)buf + uVar6 + 2);
                    if (uVar1 - local_50.table < (uint)local_50.tsize) {
                      iVar3 = 0x14;
                    }
                    else {
                      local_50.vtable = (void *)(uVar6 + (long)buf);
                      local_50.buf = buf;
                      local_50.end = uVar1;
                      iVar3 = (*tvf)(&local_50);
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
    return iVar3;
  }
  iVar3 = flatcc_verify_vector_field(td,id,required,uVar7,1,0xffffffff);
  return iVar3;
}

Assistant:

int flatcc_verify_table_as_nested_root(flatcc_table_verifier_descriptor_t *td,
        voffset_t id, int required, const char *fid,
        uint16_t align, flatcc_table_verifier_f tvf)
{
    const uoffset_t *buf;
    uoffset_t bufsiz;

    check_result(flatcc_verify_vector_field(td, id, required, align, 1, FLATBUFFERS_COUNT_MAX(1)));
    if (0 == (buf = get_field_ptr(td, id))) {
        return flatcc_verify_ok;
    }
    buf = (const uoffset_t *)((size_t)buf + read_uoffset(buf, 0));
    bufsiz = read_uoffset(buf, 0);
    ++buf;
    /*
     * Don't verify nested buffers identifier - information is difficult to get and
     * might not be what is desired anyway. User can do it later.
     */
    check_result(flatcc_verify_buffer_header(buf, bufsiz, fid));
    return verify_table(buf, bufsiz, 0, read_uoffset(buf, 0), td->ttl, tvf);
}